

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrVertexAttrib.cpp
# Opt level: O0

void rr::anon_unknown_1::readSnormClamp<int>(Vec4 *dst,int size,void *ptr)

{
  float *pfVar1;
  float fVar2;
  int local_38;
  int local_34;
  int aligned [4];
  deUint32 range;
  void *ptr_local;
  int size_local;
  Vec4 *dst_local;
  
  aligned[3] = 0x7fffffff;
  ::deMemcpy(&local_38,ptr,(long)size << 2);
  fVar2 = de::max<float>(-1.0,(float)local_38 / 2.1474836e+09);
  pfVar1 = tcu::Vector<float,_4>::operator[](dst,0);
  *pfVar1 = fVar2;
  if (1 < size) {
    fVar2 = de::max<float>(-1.0,(float)local_34 / 2.1474836e+09);
    pfVar1 = tcu::Vector<float,_4>::operator[](dst,1);
    *pfVar1 = fVar2;
  }
  if (2 < size) {
    fVar2 = de::max<float>(-1.0,(float)aligned[0] / 2.1474836e+09);
    pfVar1 = tcu::Vector<float,_4>::operator[](dst,2);
    *pfVar1 = fVar2;
  }
  if (3 < size) {
    fVar2 = de::max<float>(-1.0,(float)aligned[1] / 2.1474836e+09);
    pfVar1 = tcu::Vector<float,_4>::operator[](dst,3);
    *pfVar1 = fVar2;
  }
  return;
}

Assistant:

inline void readSnormClamp (tcu::Vec4& dst, const int size, const void* ptr)
{
	// Clamped formats, GLES3-style conversion: max{c / (2^(b-1) - 1), -1 }
	const deUint32 range = (deUint32)((1ull << (sizeof(SrcScalarType)*8-1))-1);

	SrcScalarType aligned[4];
	deMemcpy(aligned, ptr, size * sizeof(SrcScalarType));

				   dst[0] = de::max(-1.0f, float(aligned[0]) / float(range));
	if (size >= 2) dst[1] = de::max(-1.0f, float(aligned[1]) / float(range));
	if (size >= 3) dst[2] = de::max(-1.0f, float(aligned[2]) / float(range));
	if (size >= 4) dst[3] = de::max(-1.0f, float(aligned[3]) / float(range));
}